

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# retInit.c
# Opt level: O0

void Abc_NtkRetimeInsertLatchValues(Abc_Ntk_t *pNtk,Vec_Int_t *vValues)

{
  int iVar1;
  Abc_Obj_t *pAVar2;
  int local_3c;
  int local_28;
  int local_24;
  int Counter;
  int i;
  Abc_Obj_t *pObj;
  Vec_Int_t *vValues_local;
  Abc_Ntk_t *pNtk_local;
  
  local_28 = 0;
  for (local_24 = 0; iVar1 = Vec_PtrSize(pNtk->vObjs), local_24 < iVar1; local_24 = local_24 + 1) {
    pAVar2 = Abc_NtkObj(pNtk,local_24);
    if ((pAVar2 != (Abc_Obj_t *)0x0) && (iVar1 = Abc_ObjIsLatch(pAVar2), iVar1 != 0)) {
      pAVar2->field_6 = (anon_union_8_4_617c9805_for_Abc_Obj_t__17)(long)local_28;
      local_28 = local_28 + 1;
    }
  }
  for (local_24 = 0; iVar1 = Vec_PtrSize(pNtk->vObjs), local_24 < iVar1; local_24 = local_24 + 1) {
    pAVar2 = Abc_NtkObj(pNtk,local_24);
    if ((pAVar2 != (Abc_Obj_t *)0x0) && (iVar1 = Abc_ObjIsLatch(pAVar2), iVar1 != 0)) {
      if (vValues == (Vec_Int_t *)0x0) {
        local_3c = 3;
      }
      else {
        iVar1 = Vec_IntEntry(vValues,(pAVar2->field_6).iTemp);
        local_3c = 1;
        if (iVar1 != 0) {
          local_3c = 2;
        }
      }
      pAVar2->field_5 = (anon_union_8_2_00a17ec8_for_Abc_Obj_t__15)(long)local_3c;
    }
  }
  return;
}

Assistant:

void Abc_NtkRetimeInsertLatchValues( Abc_Ntk_t * pNtk, Vec_Int_t * vValues )
{
    Abc_Obj_t * pObj;
    int i, Counter = 0;
    Abc_NtkForEachObj( pNtk, pObj, i )
        if ( Abc_ObjIsLatch(pObj) )
            pObj->pCopy = (Abc_Obj_t *)(ABC_PTRUINT_T)Counter++;
    Abc_NtkForEachObj( pNtk, pObj, i )
        if ( Abc_ObjIsLatch(pObj) )
            pObj->pData = (Abc_Obj_t *)(ABC_PTRUINT_T)(vValues? (Vec_IntEntry(vValues,(int)(ABC_PTRUINT_T)pObj->pCopy)? ABC_INIT_ONE : ABC_INIT_ZERO) : ABC_INIT_DC);
}